

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.h
# Opt level: O0

HighsDomain * __thiscall HighsDomain::operator=(HighsDomain *this,HighsDomain *other)

{
  bool bVar1;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RSI;
  HighsDomain *in_RDI;
  ConflictPoolPropagation *conflictprop;
  iterator __end1_1;
  iterator __begin1_1;
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  *__range1_1;
  CutpoolPropagation *cutpoolprop;
  iterator __end1;
  iterator __begin1;
  deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_> *__range1
  ;
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  *in_stack_00000108;
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  *in_stack_00000110;
  ObjectivePropagation *in_stack_ffffffffffffff50;
  _Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
  local_88;
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  *local_68;
  reference local_60;
  _Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
  local_38;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffffe8;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffe8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe8);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator=
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)in_RSI,
             (vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
             in_stack_ffffffffffffffe8);
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::operator=
            ((vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)in_RSI,
             (vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)
             in_stack_ffffffffffffffe8);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::operator=
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)in_RSI,
             (vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             in_stack_ffffffffffffffe8);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator=
            (in_RSI,in_stack_ffffffffffffffe8);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator=
            (in_RSI,in_stack_ffffffffffffffe8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe8);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffe8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RSI,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffe8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe8);
  ObjectivePropagation::operator=(in_stack_ffffffffffffff50,(ObjectivePropagation *)in_RDI);
  in_RDI->mipsolver =
       (HighsMipSolver *)
       in_RSI[0x13].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>::
  operator=((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
             *)in_stack_00000110,
            (deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
             *)in_stack_00000108);
  std::
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  ::operator=(in_stack_00000110,in_stack_00000108);
  in_RDI->infeasible_ =
       (bool)(*(byte *)&in_RSI[0x1a].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 1);
  in_RDI->infeasible_reason =
       *(Reason *)
        ((long)&in_RSI[0x1a].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe8);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_RSI,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe8);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffe8);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffe8);
  std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>::
  begin((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_> *)
        in_RDI);
  std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>::end
            ((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
              *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff50,(_Self *)in_RDI);
    if (!bVar1) break;
    local_60 = std::
               _Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
               ::operator*(&local_38);
    local_60->domain = in_RDI;
    std::
    _Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
    ::operator++((_Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
                  *)in_stack_ffffffffffffff50);
  }
  local_68 = &in_RDI->conflictPoolPropagation;
  std::
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  ::begin((deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
           *)in_RDI);
  std::
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  ::end((deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
         *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffff50,(_Self *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffff50 =
         (ObjectivePropagation *)
         std::
         _Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
         ::operator*(&local_88);
    in_stack_ffffffffffffff50->objFunc = (HighsObjectiveFunction *)in_RDI;
    std::
    _Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
    ::operator++((_Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
                  *)in_stack_ffffffffffffff50);
  }
  if ((in_RDI->objProp_).domain != (HighsDomain *)0x0) {
    (in_RDI->objProp_).domain = in_RDI;
  }
  return in_RDI;
}

Assistant:

HighsDomain& operator=(const HighsDomain& other) {
    changedcolsflags_ = other.changedcolsflags_;
    changedcols_ = other.changedcols_;
    domchgstack_ = other.domchgstack_;
    domchgreason_ = other.domchgreason_;
    prevboundval_ = other.prevboundval_;
    activitymin_ = other.activitymin_;
    activitymax_ = other.activitymax_;
    activitymininf_ = other.activitymininf_;
    activitymaxinf_ = other.activitymaxinf_;
    capacityThreshold_ = other.capacityThreshold_;
    propagateflags_ = other.propagateflags_;
    propagateinds_ = other.propagateinds_;
    objProp_ = other.objProp_;
    mipsolver = other.mipsolver;
    cutpoolpropagation = other.cutpoolpropagation;
    conflictPoolPropagation = other.conflictPoolPropagation;
    infeasible_ = other.infeasible_;
    infeasible_reason = other.infeasible_reason;
    colLowerPos_ = other.colLowerPos_;
    colUpperPos_ = other.colUpperPos_;
    branchPos_ = other.branchPos_;
    col_lower_ = other.col_lower_;
    col_upper_ = other.col_upper_;
    for (CutpoolPropagation& cutpoolprop : cutpoolpropagation)
      cutpoolprop.domain = this;
    for (ConflictPoolPropagation& conflictprop : conflictPoolPropagation)
      conflictprop.domain = this;
    if (objProp_.domain) objProp_.domain = this;
    return *this;
  }